

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O3

void __thiscall cfd::UtxoData::UtxoData(UtxoData *this)

{
  this->block_height = 0;
  (this->block_hash)._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00723790;
  core::ByteData::ByteData(&(this->block_hash).data_);
  core::Txid::Txid(&this->txid);
  this->vout = 0;
  core::Script::Script(&this->locking_script);
  core::Script::Script(&this->redeem_script);
  core::Address::Address(&this->address);
  (this->descriptor)._M_dataplus._M_p = (pointer)&(this->descriptor).field_2;
  (this->descriptor)._M_string_length = 0;
  (this->descriptor).field_2._M_local_buf[0] = '\0';
  core::Amount::Amount(&this->amount);
  this->address_type = kP2shAddress;
  this->binary_data = (void *)0x0;
  core::ConfidentialAssetId::ConfidentialAssetId(&this->asset);
  core::ElementsConfidentialAddress::ElementsConfidentialAddress(&this->confidential_address);
  core::BlindFactor::BlindFactor(&this->asset_blind_factor);
  core::BlindFactor::BlindFactor(&this->amount_blind_factor);
  core::ConfidentialValue::ConfidentialValue(&this->value_commitment);
  core::Script::Script(&this->scriptsig_template);
  return;
}

Assistant:

UtxoData::UtxoData() {
  // do nothing
}